

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::_mod_minus1_plus1(Group *this,uint16_t member_index,float value)

{
  int iVar1;
  undefined4 extraout_var;
  float fVar2;
  float fVar3;
  Atom aAStack_18 [4];
  float local_14;
  
  local_14 = value;
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])();
  fVar2 = (float)r_code::Atom::asFloat();
  fVar2 = fVar2 + local_14;
  fVar3 = -1.0;
  if ((-1.0 <= fVar2) && (fVar3 = fVar2, 1.0 < fVar2)) {
    fVar3 = 1.0;
  }
  r_code::Atom::Float(fVar3);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,member_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),aAStack_18);
  r_code::Atom::~Atom(aAStack_18);
  return;
}

Assistant:

void Group::_mod_minus1_plus1(uint16_t member_index, float value)
{
    float v = code(member_index).asFloat() + value;

    if (v < -1) {
        v = -1;
    } else if (v > 1) {
        v = 1;
    }

    code(member_index) = Atom::Float(v);
}